

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

void speex_resampler_destroy(SpeexResamplerState *st)

{
  speex_free((void *)0x12cce2);
  speex_free((void *)0x12ccef);
  speex_free((void *)0x12ccfc);
  speex_free((void *)0x12cd09);
  speex_free((void *)0x12cd16);
  speex_free((void *)0x12cd1f);
  return;
}

Assistant:

EXPORT void speex_resampler_destroy(SpeexResamplerState *st)
{
   speex_free(st->mem);
   speex_free(st->sinc_table);
   speex_free(st->last_sample);
   speex_free(st->magic_samples);
   speex_free(st->samp_frac_num);
   speex_free(st);
}